

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_scan.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_stats_rowcol_scan
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  long lVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  parasail_result_t *ppVar7;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  int *ptr_04;
  int *ptr_05;
  int *ptr_06;
  int *ptr_07;
  int *ptr_08;
  int *ptr_09;
  int *ptr_10;
  int *ptr_11;
  int *ptr_12;
  int *ptr_13;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  int *piVar12;
  char *pcVar13;
  int iVar14;
  ulong uVar15;
  int *piVar16;
  int iVar17;
  size_t size;
  char *__format;
  int iVar18;
  undefined4 uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  size_t size_00;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int local_f0;
  int local_e0;
  int local_dc;
  int local_c4;
  ulong local_80;
  ulong local_78;
  
  local_78 = (ulong)(uint)s2Len;
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar13 = "_s2";
LAB_004ffb09:
    fprintf(_stderr,__format,"parasail_sg_flags_stats_rowcol_scan",pcVar13);
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar13 = "s2Len";
    goto LAB_004ffb09;
  }
  if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar13 = "open";
    goto LAB_004ffb09;
  }
  if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar13 = "gap";
    goto LAB_004ffb09;
  }
  local_80 = (ulong)(uint)_s1Len;
  if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar13 = "matrix";
    goto LAB_004ffb09;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
              "parasail_sg_flags_stats_rowcol_scan");
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar13 = "_s1";
      goto LAB_004ffb09;
    }
    if (_s1Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar13 = "_s1Len";
      goto LAB_004ffb09;
    }
    if (matrix->type == 0) goto LAB_004ff0d3;
  }
  local_80 = (ulong)(uint)matrix->length;
LAB_004ff0d3:
  iVar14 = (int)local_80;
  ppVar7 = parasail_result_new_rowcol3(iVar14,s2Len);
  if (ppVar7 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar7->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar7->flag | 0x1450202;
  size = (size_t)iVar14;
  ptr = parasail_memalign_int(0x10,size);
  uVar11 = (ulong)(uint)s2Len;
  ptr_00 = parasail_memalign_int(0x10,uVar11);
  size_00 = (size_t)(iVar14 + 1);
  ptr_01 = parasail_memalign_int(0x10,size_00);
  ptr_02 = parasail_memalign_int(0x10,size_00);
  ptr_03 = parasail_memalign_int(0x10,size_00);
  ptr_04 = parasail_memalign_int(0x10,size_00);
  ptr_05 = parasail_memalign_int(0x10,size);
  ptr_06 = parasail_memalign_int(0x10,size);
  ptr_07 = parasail_memalign_int(0x10,size);
  ptr_08 = parasail_memalign_int(0x10,size);
  ptr_09 = parasail_memalign_int(0x10,size_00);
  ptr_10 = parasail_memalign_int(0x10,size_00);
  ptr_11 = parasail_memalign_int(0x10,size_00);
  ptr_12 = parasail_memalign_int(0x10,size_00);
  ptr_13 = parasail_memalign_int(0x10,size);
  auVar24._0_4_ = -(uint)((int)ptr == 0);
  auVar24._4_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0);
  auVar24._8_4_ = -(uint)((int)ptr_00 == 0);
  auVar24._12_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0);
  auVar30._4_4_ = auVar24._0_4_;
  auVar30._0_4_ = auVar24._4_4_;
  auVar30._8_4_ = auVar24._12_4_;
  auVar30._12_4_ = auVar24._8_4_;
  auVar26._0_4_ = -(uint)((int)ptr_01 == 0);
  auVar26._4_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0);
  auVar26._8_4_ = -(uint)((int)ptr_02 == 0);
  auVar26._12_4_ = -(uint)((int)((ulong)ptr_02 >> 0x20) == 0);
  auVar31._4_4_ = auVar26._0_4_;
  auVar31._0_4_ = auVar26._4_4_;
  auVar31._8_4_ = auVar26._12_4_;
  auVar31._12_4_ = auVar26._8_4_;
  auVar31 = packssdw(auVar30 & auVar24,auVar31 & auVar26);
  auVar28._0_4_ = -(uint)((int)ptr_03 == 0);
  auVar28._4_4_ = -(uint)((int)((ulong)ptr_03 >> 0x20) == 0);
  auVar28._8_4_ = -(uint)((int)ptr_04 == 0);
  auVar28._12_4_ = -(uint)((int)((ulong)ptr_04 >> 0x20) == 0);
  auVar23._4_4_ = auVar28._0_4_;
  auVar23._0_4_ = auVar28._4_4_;
  auVar23._8_4_ = auVar28._12_4_;
  auVar23._12_4_ = auVar28._8_4_;
  auVar29._0_4_ = -(uint)((int)ptr_05 == 0);
  auVar29._4_4_ = -(uint)((int)((ulong)ptr_05 >> 0x20) == 0);
  auVar29._8_4_ = -(uint)((int)ptr_06 == 0);
  auVar29._12_4_ = -(uint)((int)((ulong)ptr_06 >> 0x20) == 0);
  auVar27._4_4_ = auVar29._0_4_;
  auVar27._0_4_ = auVar29._4_4_;
  auVar27._8_4_ = auVar29._12_4_;
  auVar27._12_4_ = auVar29._8_4_;
  auVar24 = packssdw(auVar23 & auVar28,auVar27 & auVar29);
  auVar24 = packssdw(auVar31,auVar24);
  if ((((((((auVar24 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar24 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar24 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar24 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar24[0xf] < '\0') {
    return (parasail_result_t *)0x0;
  }
  auVar25._0_4_ = -(uint)((int)((ulong)ptr_07 >> 0x20) == 0 && (int)ptr_07 == 0);
  auVar25._4_4_ = -(uint)((int)ptr_08 == 0 && (int)((ulong)ptr_08 >> 0x20) == 0);
  auVar25._8_4_ = -(uint)((int)((ulong)ptr_09 >> 0x20) == 0 && (int)ptr_09 == 0);
  auVar25._12_4_ = -(uint)((int)ptr_10 == 0 && (int)((ulong)ptr_10 >> 0x20) == 0);
  uVar2 = movmskps((int)ptr_10,auVar25);
  if ((char)uVar2 != '\0') {
    return (parasail_result_t *)0x0;
  }
  if (ptr_11 == (int *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (ptr_12 == (int *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (ptr_13 == (int *)0x0) {
    return (parasail_result_t *)0x0;
  }
  piVar12 = ptr_04 + 1;
  uVar8 = 0;
  uVar15 = 0;
  if (0 < iVar14) {
    uVar15 = local_80;
  }
  for (; uVar15 != uVar8; uVar8 = uVar8 + 1) {
    ptr[uVar8] = matrix->mapper[(byte)_s1[uVar8]];
  }
  piVar16 = matrix->mapper;
  for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
    ptr_00[uVar8] = piVar16[(byte)_s2[uVar8]];
  }
  *ptr_01 = 0;
  *ptr_02 = 0;
  *ptr_03 = 0;
  *ptr_04 = 0;
  *ptr_09 = 0;
  if (s1_beg == 0) {
    iVar17 = -open;
    for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
      ptr_01[uVar8 + 1] = iVar17;
      ptr_02[uVar8 + 1] = 0;
      ptr_03[uVar8 + 1] = 0;
      piVar12[uVar8] = 0;
      iVar17 = iVar17 - gap;
    }
  }
  else {
    for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
      ptr_01[uVar8 + 1] = 0;
      ptr_02[uVar8 + 1] = 0;
      ptr_03[uVar8 + 1] = 0;
      piVar12[uVar8] = 0;
    }
  }
  for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
    ptr_05[uVar8] = -0x40000000;
    ptr_06[uVar8] = 0;
    ptr_07[uVar8] = 0;
    ptr_08[uVar8] = 0;
  }
  uVar3 = s2Len - 1;
  uVar8 = (ulong)uVar3;
  uVar4 = iVar14 - 1;
  lVar1 = uVar15 * 4;
  local_f0 = -0x40000000;
  uVar22 = 0;
  local_c4 = 0;
  local_dc = 0;
  local_e0 = 0;
  do {
    if (uVar22 == uVar11) {
      if (s1_end == 0 || s2_end == 0) {
        uVar20 = (uint)local_78;
        uVar21 = (uint)local_80;
        if (s1_end != 0) {
          uVar11 = 0;
          while( true ) {
            uVar20 = (uint)local_78;
            uVar21 = (uint)local_80;
            if (uVar15 == uVar11) break;
            if (local_f0 < ptr_01[uVar11 + 1]) {
              local_c4 = ptr_02[uVar11 + 1];
              local_dc = ptr_03[uVar11 + 1];
              local_e0 = piVar12[uVar11];
              local_80 = uVar11 & 0xffffffff;
              local_78 = uVar8;
              local_f0 = ptr_01[uVar11 + 1];
            }
            uVar11 = uVar11 + 1;
          }
        }
      }
      else {
        uVar11 = 0;
        while( true ) {
          uVar20 = (uint)local_78;
          uVar21 = (uint)local_80;
          if (uVar15 == uVar11) break;
          iVar14 = ptr_01[uVar11 + 1];
          if ((local_f0 < iVar14) ||
             (((iVar14 == local_f0 && (uVar20 == uVar3)) &&
              (iVar14 = local_f0, (long)uVar11 < (long)(int)uVar21)))) {
            local_c4 = ptr_02[uVar11 + 1];
            local_dc = ptr_03[uVar11 + 1];
            local_e0 = piVar12[uVar11];
            local_80 = uVar11 & 0xffffffff;
            local_78 = uVar8;
            local_f0 = iVar14;
          }
          uVar11 = uVar11 + 1;
        }
      }
      if (s2_end == 0 && s1_end == 0) {
        local_f0 = ptr_01[(long)(int)uVar4 + 1];
        local_c4 = ptr_02[(long)(int)uVar4 + 1];
        local_dc = ptr_03[(long)(int)uVar4 + 1];
        local_e0 = piVar12[(int)uVar4];
        uVar21 = uVar4;
        uVar20 = uVar3;
      }
      ppVar7->score = local_f0;
      ppVar7->end_query = uVar21;
      ppVar7->end_ref = uVar20;
      ((ppVar7->field_4).stats)->matches = local_c4;
      ((ppVar7->field_4).stats)->similar = local_dc;
      ((ppVar7->field_4).stats)->length = local_e0;
      parasail_free(ptr_13);
      parasail_free(ptr_12);
      parasail_free(ptr_11);
      parasail_free(ptr_10);
      parasail_free(ptr_09);
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar7;
    }
    for (lVar9 = 0; lVar1 - lVar9 != 0; lVar9 = lVar9 + 4) {
      iVar14 = *(int *)((long)ptr_01 + lVar9 + 4) - open;
      iVar17 = *(int *)((long)ptr_05 + lVar9) - gap;
      if (iVar17 < iVar14) {
        *(int *)((long)ptr_05 + lVar9) = iVar14;
        *(undefined4 *)((long)ptr_06 + lVar9) = *(undefined4 *)((long)ptr_02 + lVar9 + 4);
        *(undefined4 *)((long)ptr_07 + lVar9) = *(undefined4 *)((long)ptr_03 + lVar9 + 4);
        piVar16 = piVar12;
      }
      else {
        *(int *)((long)ptr_05 + lVar9) = iVar17;
        piVar16 = ptr_08;
      }
      *(int *)((long)ptr_08 + lVar9) = *(int *)((long)piVar16 + lVar9) + 1;
    }
    iVar14 = -((int)uVar22 * gap + open);
    if (s2_beg != 0) {
      iVar14 = 0;
    }
    *ptr_09 = iVar14;
    for (uVar10 = 0; uVar15 != uVar10; uVar10 = uVar10 + 1) {
      if (matrix->type == 0) {
        iVar17 = ptr[uVar10];
      }
      else {
        iVar17 = (int)uVar10;
      }
      iVar17 = matrix->matrix[(long)(matrix->size * iVar17) + (long)ptr_00[uVar22]];
      iVar18 = ptr_01[uVar10] + iVar17;
      ptr_13[uVar10] = (uint)(iVar18 < ptr_05[uVar10]);
      if (iVar18 < ptr_05[uVar10]) {
        ptr_09[uVar10 + 1] = ptr_05[uVar10];
        ptr_10[uVar10 + 1] = ptr_06[uVar10];
        ptr_11[uVar10 + 1] = ptr_07[uVar10];
        iVar17 = ptr_08[uVar10];
      }
      else {
        ptr_09[uVar10 + 1] = iVar18;
        ptr_10[uVar10 + 1] = (uint)(ptr[uVar10] == ptr_00[uVar22]) + ptr_02[uVar10];
        ptr_11[uVar10 + 1] = (uint)(0 < iVar17) + ptr_03[uVar10];
        iVar17 = ptr_04[uVar10] + 1;
      }
      ptr_12[uVar10 + 1] = iVar17;
    }
    iVar18 = -0x40000000;
    uVar2 = 0;
    uVar19 = 0;
    iVar17 = 0;
    for (lVar9 = 0; lVar1 - lVar9 != 0; lVar9 = lVar9 + 4) {
      iVar5 = iVar18 - gap;
      iVar18 = *(int *)((long)ptr_09 + lVar9);
      if (*(int *)((long)ptr_09 + lVar9) <= iVar5) {
        iVar18 = iVar5;
      }
      if (iVar5 < *(int *)((long)ptr_01 + lVar9)) {
        uVar2 = *(undefined4 *)((long)ptr_02 + lVar9);
        uVar19 = *(undefined4 *)((long)ptr_03 + lVar9);
        iVar17 = *(int *)((long)ptr_04 + lVar9);
      }
      iVar6 = iVar18 - open;
      iVar17 = iVar17 + 1;
      iVar5 = *(int *)((long)ptr_09 + lVar9 + 4);
      if (iVar6 < iVar5) {
        *(int *)((long)ptr_01 + lVar9 + 4) = iVar5;
LAB_004ff6cf:
        *(undefined4 *)((long)ptr_02 + lVar9 + 4) = *(undefined4 *)((long)ptr_10 + lVar9 + 4);
        *(undefined4 *)((long)ptr_03 + lVar9 + 4) = *(undefined4 *)((long)ptr_11 + lVar9 + 4);
        iVar5 = *(int *)((long)ptr_12 + lVar9 + 4);
      }
      else {
        *(int *)((long)ptr_01 + lVar9 + 4) = iVar6;
        if ((*(int *)((long)ptr_09 + lVar9 + 4) == iVar6) && (*(int *)((long)ptr_13 + lVar9) == 0))
        goto LAB_004ff6cf;
        *(undefined4 *)((long)ptr_02 + lVar9 + 4) = uVar2;
        *(undefined4 *)((long)ptr_03 + lVar9 + 4) = uVar19;
        iVar5 = iVar17;
      }
      *(int *)((long)piVar12 + lVar9) = iVar5;
    }
    *ptr_01 = iVar14;
    if (uVar22 == uVar8) {
      for (lVar9 = 0; lVar1 - lVar9 != 0; lVar9 = lVar9 + 4) {
        *(undefined4 *)(*(long *)((long)((ppVar7->field_4).trace)->trace_del_table + 0x20) + lVar9)
             = *(undefined4 *)((long)ptr_01 + lVar9 + 4);
        *(undefined4 *)(*(long *)((long)((ppVar7->field_4).trace)->trace_del_table + 0x28) + lVar9)
             = *(undefined4 *)((long)ptr_02 + lVar9 + 4);
        *(undefined4 *)(*(long *)((long)((ppVar7->field_4).trace)->trace_del_table + 0x30) + lVar9)
             = *(undefined4 *)((long)ptr_03 + lVar9 + 4);
        *(undefined4 *)(*(long *)((long)((ppVar7->field_4).trace)->trace_del_table + 0x38) + lVar9)
             = *(undefined4 *)((long)piVar12 + lVar9);
      }
    }
    *(int *)(*((ppVar7->field_4).trace)->trace_del_table + uVar22 * 4) =
         ptr_01[(long)(int)uVar4 + 1];
    *(int *)(*(long *)((long)((ppVar7->field_4).trace)->trace_del_table + 8) + uVar22 * 4) =
         ptr_02[(long)(int)uVar4 + 1];
    *(int *)(*(long *)((long)((ppVar7->field_4).trace)->trace_del_table + 0x10) + uVar22 * 4) =
         ptr_03[(long)(int)uVar4 + 1];
    iVar14 = piVar12[(int)uVar4];
    *(int *)(*(long *)((long)((ppVar7->field_4).trace)->trace_del_table + 0x18) + uVar22 * 4) =
         iVar14;
    if ((s2_end != 0) && (local_f0 < ptr_01[(long)(int)uVar4 + 1])) {
      local_c4 = ptr_02[(long)(int)uVar4 + 1];
      local_dc = ptr_03[(long)(int)uVar4 + 1];
      local_80 = (ulong)uVar4;
      local_78 = uVar22 & 0xffffffff;
      local_e0 = iVar14;
      local_f0 = ptr_01[(long)(int)uVar4 + 1];
    }
    uVar22 = uVar22 + 1;
  } while( true );
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict HB = NULL;
    int * restrict H = NULL;
    int * restrict HMB = NULL;
    int * restrict HM = NULL;
    int * restrict HSB = NULL;
    int * restrict HS = NULL;
    int * restrict HLB = NULL;
    int * restrict HL = NULL;
    int * restrict E = NULL;
    int * restrict EM = NULL;
    int * restrict ES = NULL;
    int * restrict EL = NULL;
    int * restrict HtB = NULL;
    int * restrict Ht = NULL;
    int * restrict HtMB = NULL;
    int * restrict HtM = NULL;
    int * restrict HtSB = NULL;
    int * restrict HtS = NULL;
    int * restrict HtLB = NULL;
    int * restrict HtL = NULL;
    int * restrict Ex = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;
    int score = 0;
    int matches = 0;
    int similar = 0;
    int length = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    i = 0;
    j = 0;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    score = NEG_INF_32;
    matches = 0;
    similar = 0;
    length = 0;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_NOVEC_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);
    HB = parasail_memalign_int(16, s1Len+1);
    H  = HB+1;
    HMB = parasail_memalign_int(16, s1Len+1);
    HM  = HMB+1;
    HSB = parasail_memalign_int(16, s1Len+1);
    HS  = HSB+1;
    HLB = parasail_memalign_int(16, s1Len+1);
    HL  = HLB+1;
    E  = parasail_memalign_int(16, s1Len);
    EM = parasail_memalign_int(16, s1Len);
    ES = parasail_memalign_int(16, s1Len);
    EL = parasail_memalign_int(16, s1Len);
    HtB= parasail_memalign_int(16, s1Len+1);
    Ht = HtB+1;
    HtMB= parasail_memalign_int(16, s1Len+1);
    HtM = HtMB+1;
    HtSB= parasail_memalign_int(16, s1Len+1);
    HtS = HtSB+1;
    HtLB= parasail_memalign_int(16, s1Len+1);
    HtL = HtLB+1;
    Ex = parasail_memalign_int(16, s1Len);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;
    if (!HB) return NULL;
    if (!HMB) return NULL;
    if (!HSB) return NULL;
    if (!HLB) return NULL;
    if (!E) return NULL;
    if (!EM) return NULL;
    if (!ES) return NULL;
    if (!EL) return NULL;
    if (!HtB) return NULL;
    if (!HtMB) return NULL;
    if (!HtSB) return NULL;
    if (!HtLB) return NULL;
    if (!Ex) return NULL;

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* initialize H,HM,HS,HL */
    H[-1] = 0;
    HM[-1] = 0;
    HS[-1] = 0;
    HL[-1] = 0;
    Ht[-1] = 0;
    if (s1_beg) {
        for (i=0; i<s1Len; ++i) {
            H[i] = 0;
            HM[i] = 0;
            HS[i] = 0;
            HL[i] = 0;
        }
    }
    else {
        for (i=0; i<s1Len; ++i) {
            H[i] = -open -i*gap;
            HM[i] = 0;
            HS[i] = 0;
            HL[i] = 0;
        }
    }

    /* initialize E */
    for (i=0; i<s1Len; ++i) {
        E[i] = NEG_INF_32;
        EM[i] = 0;
        ES[i] = 0;
        EL[i] = 0;
    }

    /* iterate over database */
    for (j=0; j<s2Len; ++j) {
        int Ft = NEG_INF_32;
        int FtM = 0;
        int FtS = 0;
        int FtL = 0;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            int E_opn = H[i]-open;
            int E_ext = E[i]-gap;
            if (E_opn > E_ext) {
                E[i] = E_opn;
                EM[i] = HM[i];
                ES[i] = HS[i];
                EL[i] = HL[i];
            }
            else {
                E[i] = E_ext;
            }
            EL[i] += 1;
        }
        /* calculate Ht */
        Ht[-1] = s2_beg ? 0 : (-open -j*gap);
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            int H_dag = H[i-1]+matval;
            Ex[i] = (E[i] > H_dag);
            if (H_dag >= E[i]) {
                Ht[i] = H_dag;
                HtM[i] = HM[i-1] + (s1[i]==s2[j]);
                HtS[i] = HS[i-1] + (matval > 0);
                HtL[i] = HL[i-1] + 1;
            }
            else {
                Ht[i] = E[i];
                HtM[i] = EM[i];
                HtS[i] = ES[i];
                HtL[i] = EL[i];
            }
        }
        /* calculate H,HM,HS,HL */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            if (H[i-1] > Ft_ext) {
                FtM = HM[i-1];
                FtS = HS[i-1];
                FtL = HL[i-1];
            }
            FtL += 1;
            if (Ht[i] > Ft_opn) {
                H[i] = Ht[i];
                HM[i] = HtM[i];
                HS[i] = HtS[i];
                HL[i] = HtL[i];
            }
            else {
                H[i] = Ft_opn;
                if (Ht[i] == Ft_opn) {
                    if (Ex[i]) {
                        /* we favor F/up/del when F and E scores tie */
                        HM[i] = FtM;
                        HS[i] = FtS;
                        HL[i] = FtL;
                    }
                    else {
                        HM[i] = HtM[i];
                        HS[i] = HtS[i];
                        HL[i] = HtL[i];
                    }
                }
                else {
                    HM[i] = FtM;
                    HS[i] = FtS;
                    HL[i] = FtL;
                }
            }
#ifdef PARASAIL_TABLE
            result->stats->tables->score_table[1LL*i*s2Len + j] = H[i];
            result->stats->tables->matches_table[1LL*i*s2Len + j] = HM[i];
            result->stats->tables->similar_table[1LL*i*s2Len + j] = HS[i];
            result->stats->tables->length_table[1LL*i*s2Len + j] = HL[i];
#endif
        }
        H[-1] = s2_beg ? 0 : (-open - j*gap);
#ifdef PARASAIL_ROWCOL
        if (j == s2Len-1) {
            for (i=0; i<s1Len; ++i) {
                result->stats->rowcols->score_col[i] = H[i];
                result->stats->rowcols->matches_col[i] = HM[i];
                result->stats->rowcols->similar_col[i] = HS[i];
                result->stats->rowcols->length_col[i] = HL[i];
            }
        }
        result->stats->rowcols->score_row[j] = H[s1Len-1];
        result->stats->rowcols->matches_row[j] = HM[s1Len-1];
        result->stats->rowcols->similar_row[j] = HS[s1Len-1];
        result->stats->rowcols->length_row[j] = HL[s1Len-1];
#endif
        /* last value from column */
        if (s2_end && H[s1Len-1] > score) {
            score = H[s1Len-1];
            matches = HM[s1Len-1];
            similar = HS[s1Len-1];
            length = HL[s1Len-1];
            end_query = s1Len-1;
            end_ref = j;
        }
    }
    /* max of last column */
    if (s1_end && s2_end) {
        for (i=0; i<s1Len; ++i) {
            if (H[i] > score) {
                score = H[i];
                matches = HM[i];
                similar = HS[i];
                length = HL[i];
                end_query = i;
                end_ref = s2Len-1;
            }
            else if (H[i] == score && end_ref == s2Len-1 && i < end_query) {
                matches = HM[i];
                similar = HS[i];
                length = HL[i];
                end_query = i;
                end_ref = s2Len-1;
            }
        }
    }
    else if (s1_end) {
        for (i=0; i<s1Len; ++i) {
            if (H[i] > score) {
                score = H[i];
                matches = HM[i];
                similar = HS[i];
                length = HL[i];
                end_query = i;
                end_ref = s2Len-1;
            }
        }
    }
    if (!s1_end && !s2_end) {
        score = H[s1Len-1];
        matches = HM[s1Len-1];
        similar = HS[s1Len-1];
        length = HL[s1Len-1];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(Ex);
    parasail_free(HtLB);
    parasail_free(HtSB);
    parasail_free(HtMB);
    parasail_free(HtB);
    parasail_free(EL);
    parasail_free(ES);
    parasail_free(EM);
    parasail_free(E);
    parasail_free(HLB);
    parasail_free(HSB);
    parasail_free(HMB);
    parasail_free(HB);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}